

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersect_range_benchmark.c
# Opt level: O0

_Bool range_intersect(void *base,testvalue_t tv)

{
  _Bool _Var1;
  char *pcVar2;
  char *pcVar3;
  uint64_t in_RDI;
  uint64_t unaff_retaddr;
  roaring_bitmap_t *in_stack_00000008;
  uint in_stack_00000010;
  uint in_stack_00000014;
  uint in_stack_00000018;
  undefined4 in_stack_0000001c;
  _Bool res;
  
  _Var1 = roaring_bitmap_intersect_with_range(in_stack_00000008,unaff_retaddr,in_RDI);
  if (_Var1 != (_Bool)(base._4_1_ & 1)) {
    pcVar3 = "\'false\'";
    if (((ulong)base & 0x100000000) != 0) {
      pcVar3 = "\'true\'";
    }
    pcVar2 = "\'false\'";
    if (_Var1) {
      pcVar2 = "\'true\'";
    }
    printf("ERROR: expected %s but got %s for intersection of bitmap [%u,%u,%u] with range [%u,%u]\n"
           ,pcVar3,pcVar2,(ulong)in_stack_00000010,(ulong)in_stack_00000014,(ulong)in_stack_00000018
           ,in_stack_0000001c,base._0_4_);
  }
  return _Var1;
}

Assistant:

static bool range_intersect(void *base, testvalue_t tv) {
    (void)base;
    bool res = roaring_bitmap_intersect_with_range(tv.bitmap, tv.range[0],
                                                   tv.range[1]);
    if (paranoid && res != tv.expected) {
        printf(
            "ERROR: expected %s but got %s for intersection of bitmap "
            "[%u,%u,%u] with range [%u,%u]\n",
            tv.expected ? "'true'" : "'false'", res ? "'true'" : "'false'",
            tv.bitmap_range[0], tv.bitmap_range[1], tv.bitmap_range[2],
            tv.range[0], tv.range[1]);
    }
    return res;
}